

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssdp_ctrlpt.c
# Opt level: O2

void searchExpired(void *arg)

{
  UpnpClient_Handle Hnd;
  int iVar1;
  int *__ptr;
  Upnp_Handle_Type UVar2;
  ListNode *dnode;
  ListNode *pLVar3;
  int in_ESI;
  int iVar4;
  undefined8 uVar6;
  Handle_Info *ctrlpt_info;
  LISTNODE *local_38;
  ListNode *pLVar5;
  
  Hnd = *arg;
  iVar1 = *(int *)((long)arg + 4);
  pLVar5 = (ListNode *)&ctrlpt_info;
  ctrlpt_info = (Handle_Info *)0x0;
  HandleLock((char *)0x21e,in_ESI);
  UVar2 = GetHandleInfo(Hnd,(Handle_Info **)pLVar5);
  iVar4 = (int)pLVar5;
  if (UVar2 == HND_CLIENT) {
    local_38 = (LISTNODE *)ctrlpt_info->Callback;
    dnode = ListHead(&ctrlpt_info->SsdpSearchList);
    uVar6 = 0;
    while (iVar4 = (int)pLVar5, dnode != (ListNode *)0x0) {
      __ptr = (int *)dnode->item;
      if (*__ptr == iVar1) {
        free(*(void **)(__ptr + 2));
        uVar6 = *(undefined8 *)(__ptr + 4);
        free(__ptr);
        pLVar5 = dnode;
        ListDelNode(&ctrlpt_info->SsdpSearchList,dnode,0);
        iVar4 = (int)pLVar5;
        break;
      }
      pLVar3 = ListNext(&ctrlpt_info->SsdpSearchList,dnode);
      pLVar5 = dnode;
      dnode = pLVar3;
    }
    HandleUnlock((char *)0x235,iVar4);
    if (dnode != (ListNode *)0x0) {
      (*(code *)local_38)(7,0,uVar6);
    }
    free(arg);
  }
  else {
    free(arg);
    HandleUnlock((char *)0x223,iVar4);
  }
  return;
}

Assistant:

static void searchExpired(
	/* [in] . */
	void *arg)
{
	int id = ((SsdpSearchExpArg *)arg)->timeoutEventId;
	int handle = ((SsdpSearchExpArg *)arg)->handle;
	struct Handle_Info *ctrlpt_info = NULL;

	/* remove search Target from list and call client back */
	ListNode *node = NULL;
	SsdpSearchArg *item;
	Upnp_FunPtr ctrlpt_callback;
	void *cookie = NULL;
	int found = 0;

	HandleLock(__FILE__, __LINE__);

	/* remove search target from search list */
	if (GetHandleInfo(handle, &ctrlpt_info) != HND_CLIENT) {
		free(arg);
		HandleUnlock(__FILE__, __LINE__);
		return;
	}
	ctrlpt_callback = ctrlpt_info->Callback;
	node = ListHead(&ctrlpt_info->SsdpSearchList);
	while (node != NULL) {
		item = (SsdpSearchArg *)node->item;
		if (item->timeoutEventId == id) {
			free(item->searchTarget);
			cookie = item->cookie;
			found = 1;
			item->searchTarget = NULL;
			free(item);
			ListDelNode(&ctrlpt_info->SsdpSearchList, node, 0);
			break;
		}
		node = ListNext(&ctrlpt_info->SsdpSearchList, node);
	}
	HandleUnlock(__FILE__, __LINE__);

	if (found)
		ctrlpt_callback(UPNP_DISCOVERY_SEARCH_TIMEOUT, NULL, cookie);

	free(arg);
}